

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_wav__read_chunk_header
                    (ma_dr_wav_read_proc onRead,void *pUserData,ma_dr_wav_container container,
                    ma_uint64 *pRunningBytesReadOut,ma_dr_wav_chunk_header *pHeaderOut)

{
  uint uVar1;
  long lVar2;
  ma_uint64 mVar3;
  long *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  code *in_RDI;
  long in_R8;
  ma_uint8 sizeInBytes_1 [8];
  ma_uint8 sizeInBytes [4];
  ma_uint8 local_64 [8];
  undefined4 local_5c;
  long local_58;
  long *local_50;
  int local_44;
  undefined8 local_40;
  code *local_38;
  int local_2c;
  undefined4 *local_28;
  uint local_1c;
  int local_18;
  int local_14;
  undefined4 *local_10;
  undefined4 *local_8;
  
  local_58 = in_R8;
  local_50 = in_RCX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  if ((((in_EDX == 0) || (in_EDX == 1)) || (in_EDX == 3)) || (in_EDX == 4)) {
    local_44 = in_EDX;
    lVar2 = (*in_RDI)(in_RSI,in_R8,4);
    if (lVar2 != 4) {
      return MA_AT_END;
    }
    lVar2 = (*local_38)(local_40,&local_5c,4);
    if (lVar2 != 4) {
      return MA_INVALID_FILE;
    }
    local_28 = &local_5c;
    local_2c = local_44;
    local_18 = local_44;
    if ((local_44 == 1) || (local_44 == 4)) {
      local_14 = 1;
    }
    else {
      local_14 = 0;
    }
    if (local_14 == 0) {
      local_1c = local_5c;
      local_10 = local_28;
    }
    else {
      local_1c = CONCAT13((undefined1)local_5c,
                          CONCAT12(local_5c._1_1_,CONCAT11(local_5c._2_1_,local_5c._3_1_)));
      local_8 = local_28;
    }
    *(ulong *)(local_58 + 0x10) = (ulong)local_1c;
    uVar1 = ma_dr_wav__chunk_padding_size_riff(*(ma_uint64 *)(local_58 + 0x10));
    *(uint *)(local_58 + 0x18) = uVar1;
    *local_50 = *local_50 + 8;
  }
  else {
    if (in_EDX != 2) {
      return MA_INVALID_FILE;
    }
    lVar2 = (*in_RDI)(in_RSI,in_R8,0x10);
    if (lVar2 != 0x10) {
      return MA_AT_END;
    }
    lVar2 = (*local_38)(local_40,local_64,8);
    if (lVar2 != 8) {
      return MA_INVALID_FILE;
    }
    mVar3 = ma_dr_wav_bytes_to_u64(local_64);
    *(ma_uint64 *)(local_58 + 0x10) = mVar3 - 0x18;
    uVar1 = ma_dr_wav__chunk_padding_size_w64(*(ma_uint64 *)(local_58 + 0x10));
    *(uint *)(local_58 + 0x18) = uVar1;
    *local_50 = *local_50 + 0x18;
  }
  return MA_SUCCESS;
}

Assistant:

MA_PRIVATE ma_result ma_dr_wav__read_chunk_header(ma_dr_wav_read_proc onRead, void* pUserData, ma_dr_wav_container container, ma_uint64* pRunningBytesReadOut, ma_dr_wav_chunk_header* pHeaderOut)
{
    if (container == ma_dr_wav_container_riff || container == ma_dr_wav_container_rifx || container == ma_dr_wav_container_rf64 || container == ma_dr_wav_container_aiff) {
        ma_uint8 sizeInBytes[4];
        if (onRead(pUserData, pHeaderOut->id.fourcc, 4) != 4) {
            return MA_AT_END;
        }
        if (onRead(pUserData, sizeInBytes, 4) != 4) {
            return MA_INVALID_FILE;
        }
        pHeaderOut->sizeInBytes = ma_dr_wav_bytes_to_u32_ex(sizeInBytes, container);
        pHeaderOut->paddingSize = ma_dr_wav__chunk_padding_size_riff(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 8;
    } else if (container == ma_dr_wav_container_w64) {
        ma_uint8 sizeInBytes[8];
        if (onRead(pUserData, pHeaderOut->id.guid, 16) != 16) {
            return MA_AT_END;
        }
        if (onRead(pUserData, sizeInBytes, 8) != 8) {
            return MA_INVALID_FILE;
        }
        pHeaderOut->sizeInBytes = ma_dr_wav_bytes_to_u64(sizeInBytes) - 24;
        pHeaderOut->paddingSize = ma_dr_wav__chunk_padding_size_w64(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 24;
    } else {
        return MA_INVALID_FILE;
    }
    return MA_SUCCESS;
}